

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr.cpp
# Opt level: O0

void duckdb::ChrOperator::GetCodepoint(int32_t input,char *c,int *utf8_bytes)

{
  undefined8 uVar1;
  byte bVar2;
  int *in_RDX;
  char *in_RSI;
  int in_EDI;
  allocator local_39;
  string local_38 [12];
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  InvalidInputException *in_stack_ffffffffffffffe0;
  
  if (-1 < in_EDI) {
    bVar2 = duckdb::Utf8Proc::CodepointToUtf8(in_EDI,in_RDX,in_RSI);
    if ((bVar2 & 1) != 0) {
      return;
    }
  }
  uVar1 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Invalid UTF8 Codepoint %d",&local_39);
  InvalidInputException::InvalidInputException<int>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  __cxa_throw(uVar1,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

static void GetCodepoint(int32_t input, char c[], int &utf8_bytes) {
		if (input < 0 || !Utf8Proc::CodepointToUtf8(input, utf8_bytes, &c[0])) {
			throw InvalidInputException("Invalid UTF8 Codepoint %d", input);
		}
	}